

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,2,1,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  pointer puVar5;
  pair<unsigned_long,_unsigned_long> *ppVar6;
  comm *comm_00;
  comm *comm_01;
  unsigned_long uVar7;
  _Elt_pointer ppVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  long *plVar11;
  _Elt_pointer ppVar12;
  _Map_pointer pppVar13;
  _Map_pointer pppVar14;
  _Map_pointer pppVar15;
  int iVar16;
  ulong *puVar17;
  _Elt_pointer ppVar18;
  ulong uVar19;
  _Elt_pointer ppVar20;
  long lVar21;
  ulong uVar22;
  unsigned_long uVar23;
  unsigned_long uVar24;
  ulong uVar25;
  _Elt_pointer ppVar26;
  ulong uVar27;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar28;
  pointer puVar29;
  pair<unsigned_long,_unsigned_long> *ppVar30;
  ulong uVar31;
  _Map_pointer pppVar32;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  _Elt_pointer ppVar37;
  bool bVar38;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1c0;
  _Elt_pointer local_1b8;
  _Elt_pointer ppStack_1b0;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a0;
  comm *local_198;
  _Elt_pointer ppStack_190;
  _Elt_pointer local_188;
  _Elt_pointer ppStack_180;
  size_type local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Map_pointer local_150;
  unsigned_long local_140;
  pair<unsigned_long,_unsigned_long> local_138;
  size_t local_128;
  ulong local_120;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _Map_pointer local_a0;
  ulong local_98;
  size_type local_90;
  long local_88;
  long local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1b8 = (_Elt_pointer)left_nsv;
  local_1a8 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_128 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_218,0);
  local_170 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_198 = comm;
  uVar7 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_170,comm);
  lVar35 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1c0 = in;
  if (lVar35 != 0) {
    lVar35 = lVar35 >> 3;
    do {
      ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar33 = (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar35 + -1];
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar33
               ) break;
            operator_delete(ppVar12);
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12 + 0x1f;
            ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar33)
            break;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10);
        ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10) {
          do {
            uVar23 = (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar35 + -1];
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) {
              if (uVar23 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar12);
              ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12 + 0x1f;
              ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar23 != local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10);
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar7 - 1) + lVar35);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar35 + -1];
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar35 = lVar35 + -1;
    } while (lVar35 != 0);
  }
  local_58.current._M_cur = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_218._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_58,&local_78,(allocator_type *)&local_b8);
  pvVar3 = *(void **)local_1a8;
  *(pointer *)local_1a8 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_1a8 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_1a8 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3),
     local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar33 = ((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_218._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_218._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_218._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  local_1a0 = right_nsv;
  pppVar13 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar28 = local_1c0;
  if (uVar33 == 0) {
    local_140 = uVar7;
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 1]"
                 );
  }
  for (; local_1c0 = pvVar28, local_140 = uVar7, pppVar13 < pppVar15; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
    uVar7 = local_140;
    pvVar28 = local_1c0;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar14;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = local_188;
  if ((pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar36 = 0;
    ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
LAB_0013e647:
    do {
      pppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar9) {
        uVar22 = (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar36];
        ppVar10 = ppVar9;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) {
          if (uVar22 < local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar12);
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12 + 0x1f;
            ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_0013e647;
          }
        }
        else if (uVar22 < local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_0013e647;
        }
      }
      while( true ) {
        uVar22 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar12 >>
                 4;
        puVar29 = (pointer)(pvVar28->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar36];
        if (((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar10 >> 4) +
            uVar22 + ((((ulong)((long)pppVar13 -
                               (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar13 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) {
          ppVar9 = pppVar13[-1] + 0x20;
        }
        if (puVar29 != (pointer)ppVar9[-1].first) break;
        uVar19 = uVar22 - 1;
        if ((long)uVar22 < 1) {
          uVar22 = (long)uVar19 >> 5;
LAB_0013e747:
          pppVar14 = pppVar13 + uVar22;
          ppVar8 = *pppVar14;
          ppVar9 = ppVar8 + uVar19 + uVar22 * -0x20;
        }
        else {
          if (0x20 < uVar22) {
            uVar22 = uVar19 >> 5;
            goto LAB_0013e747;
          }
          ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar14 = pppVar13;
          ppVar8 = ppVar12;
        }
        if (ppVar9 == ppVar8) {
          ppVar9 = pppVar14[-1] + 0x20;
        }
        if (puVar29 != (pointer)ppVar9[-1].first) break;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) {
          operator_delete(ppVar12);
          pppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12 + 0x1f;
          ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar13;
        }
        else {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar36 + uVar7);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar29;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = (unsigned_long)puVar29;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar36 = uVar36 + 1;
      ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (uVar36 < (ulong)((long)(pvVar28->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar28->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar20 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar8 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar36 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar38 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_a0 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_1a8,*(undefined8 *)(local_1a8 + 8));
  pppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_120 = (local_218._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar35 = ((long)ppVar9 - (long)ppVar12 >> 4) + ((long)ppVar8 - (long)ppVar20 >> 4) +
           (((uVar36 >> 3) - 1) + (ulong)bVar38) * 0x20;
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar13 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_198;
  if (lVar35 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 1]"
                 );
  }
  for (; local_188 = ppVar12, local_198 = comm_00, pppVar13 < pppVar15; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
    ppVar12 = local_188;
    comm_00 = local_198;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar14;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  if (lVar35 + uVar33 != *(long *)(local_1a8 + 8) - *(long *)local_1a8 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_120,1,comm_00);
  local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,(long)comm_00->m_size,(value_type_conflict *)&local_d0,
             (allocator_type *)&local_100);
  local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,(long)comm_00->m_size,(value_type_conflict *)&local_100,
             (allocator_type *)&local_e8);
  comm_01 = local_198;
  iVar1 = comm_00->m_rank;
  lVar35 = (long)iVar1;
  if (0 < lVar35) {
    uVar36 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar35 * 8 + -8);
    lVar34 = lVar35;
    uVar7 = 0;
    do {
      lVar21 = lVar34 + -1;
      uVar22 = uVar7 + 1;
      if (uVar7 + 1 < uVar33) {
        uVar22 = uVar33;
      }
      uVar19 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar34 * 8 + -8);
      uVar23 = uVar7 - 1;
      puVar17 = (ulong *)(uVar7 * 0x10 + *(long *)local_1a8);
      do {
        uVar24 = uVar22 - 1;
        if ((1 - uVar22) + uVar23 == -1) break;
        uVar24 = uVar23 + 1;
        uVar27 = *puVar17;
        uVar23 = uVar24;
        puVar17 = puVar17 + 2;
      } while (uVar19 <= uVar27);
      if (uVar19 <= uVar36) {
        *(unsigned_long *)
         ((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar21 * 8) = (uVar24 - uVar7) + 1;
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar21] = uVar7;
        uVar36 = uVar19;
        if (*(ulong *)((long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar21 * 8) < local_120)
        break;
      }
      bVar38 = 1 < lVar34;
      lVar34 = lVar21;
      uVar7 = uVar24;
    } while (bVar38);
  }
  iVar2 = local_198->m_size;
  if (iVar1 < iVar2 + -1) {
    lVar34 = *(long *)local_1a8;
    uVar19 = *(long *)(local_1a8 + 8) - lVar34 >> 4;
    uVar36 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar35];
    local_188 = (_Elt_pointer)
                local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar35 = lVar35 + 1;
    uVar22 = uVar19 - 1;
    iVar16 = iVar1;
    do {
      uVar27 = uVar22;
      if (iVar1 < iVar16) {
        uVar31 = uVar22 + 1;
        if (uVar22 + 1 < uVar19) {
          uVar31 = uVar19;
        }
        puVar17 = (ulong *)(uVar22 * 0x10 + lVar34 + 0x10);
        uVar25 = uVar22 - 1;
        do {
          uVar27 = uVar31 - 1;
          if (uVar19 <= uVar25 + 2) break;
          uVar27 = uVar25 + 1;
          uVar4 = *puVar17;
          puVar17 = puVar17 + 2;
          uVar25 = uVar27;
        } while (uVar4 <= uVar36);
      }
      uVar31 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar35];
      uVar25 = uVar22;
      if (uVar33 < uVar22) {
        puVar17 = (ulong *)(uVar22 * 0x10 + lVar34);
        do {
          uVar25 = uVar22;
          if (*puVar17 < uVar31) break;
          uVar22 = uVar22 - 1;
          puVar17 = puVar17 + -2;
          uVar25 = uVar33;
        } while (uVar33 < uVar22);
      }
      if (uVar31 <= uVar36) {
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar35] = (uVar27 - uVar25) + 1;
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar35] = uVar25;
        uVar36 = uVar31;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar35] < local_120) break;
      }
      iVar16 = (int)lVar35;
      lVar35 = lVar35 + 1;
      uVar22 = uVar25;
    } while (iVar2 != (int)lVar35);
  }
  mxx::all2all<unsigned_long>(&local_100,&local_b8,local_198);
  mxx::impl::get_displacements<unsigned_long>(&local_e8,&local_100);
  this = local_1a0;
  uVar7 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  uVar23 = local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_118,uVar7 + uVar23,(allocator_type *)&local_138);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_1a8,&local_b8,&local_d0,
             local_118.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_100,&local_e8,comm_01);
  local_188 = (_Elt_pointer)
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  local_90 = uVar7 + uVar23;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,local_170);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this,local_170);
  pppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = (comm *)local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pvVar28 = local_1c0;
  for (pppVar13 = local_218._M_impl.super__Deque_impl_data._M_start._M_node; local_1c0 = pvVar28,
      pppVar13 < pppVar15; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
    pvVar28 = local_1c0;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar14;
  lVar35 = (long)(pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_198;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar35 != 0) {
    uVar33 = lVar35 >> 3;
    do {
      uVar33 = uVar33 - 1;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar29 = (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar36 = puVar29[uVar33];
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) {
            ppVar30 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar30[0x1f].first <= uVar36) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar30[0x1f].second] = uVar33;
            ppVar10 = ppVar30 + 0x20;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar36)
            break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar33;
            ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar7 = ppVar10[-1].first;
          uVar23 = ppVar10[-1].second;
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12)
          goto LAB_0013eda5;
          while( true ) {
            operator_delete(ppVar12);
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12 + 0x1f;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_218._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0013edde;
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) break;
              if (uVar7 != local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_0013edd5;
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
              _M_impl).super__Vector_impl_data._M_start
              [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar23;
LAB_0013eda5:
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar7 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first)
            break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar23;
          }
LAB_0013edd5:
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_218._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        } while( true );
      }
LAB_0013edde:
      pvVar28 = local_1c0;
      local_138.first =
           (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar33];
      local_138.second = uVar33;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,&local_138);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar33;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      this = local_1a0;
    } while (uVar33 != 0);
  }
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_188 != (_Elt_pointer)0x0) {
    local_98 = (long)local_188 - 1;
    local_88 = (long)local_188 * 0x10 + -0x10;
    uVar33 = 0;
    ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_0013ee7d:
    if (ppVar9 != ppVar12) {
      lVar35 = ~uVar33 + (long)local_188;
      local_80 = lVar35 * 0x10;
      local_198 = (comm *)(local_118.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar35);
      local_140 = local_170 + lVar35;
      ppVar8 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_0013eece:
      if (ppVar9 == ppVar8) {
        ppVar30 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar30[0x1f].first <= local_198->_vptr_comm) goto LAB_0013f033;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar30[0x1f].second] = local_140;
        uVar7 = ppVar30[0x1f].first;
        uVar23 = ppVar30[0x1f].second;
        operator_delete(ppVar8);
        ppVar8 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar8 + 0x20;
        ppVar9 = ppVar8 + 0x1f;
        ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar8;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar9[-1].first <= local_198->_vptr_comm) goto LAB_0013f033;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar9[-1].second] = local_140;
        uVar7 = ppVar9[-1].first;
        uVar23 = ppVar9[-1].second;
        ppVar9 = ppVar9 + -1;
      }
      ppVar10 = ppVar9;
      local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
      if (ppVar9 != ppVar12) {
        do {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
          if (ppVar9 == ppVar8) {
            if (uVar7 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first)
            goto LAB_0013f022;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar23;
            operator_delete(ppVar8);
            ppVar8 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar8 + 0x20;
            ppVar9 = ppVar8 + 0x1f;
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar8;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar7 != ppVar9[-1].first) goto LAB_0013f022;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar9[-1].second] = uVar23;
            ppVar9 = ppVar9 + -1;
          }
          ppVar10 = ppVar9;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
          if (ppVar9 == ppVar12) break;
        } while( true );
      }
      goto LAB_0013f033;
    }
  }
LAB_0013f195:
  pppVar13 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  local_198 = (comm *)local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (ppVar10 != ppVar12) {
    puVar29 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
              _M_impl).super__Vector_impl_data._M_start;
    pppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_0013f1ce:
    puVar5 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
             _M_impl).super__Vector_impl_data._M_start;
    pppVar15 = pppVar14;
    ppVar20 = ppVar9;
    ppVar8 = ppVar10;
    do {
      uVar19 = (long)ppVar8 - (long)ppVar20 >> 4;
      uVar33 = uVar19 - 1;
      uVar22 = (long)uVar33 >> 5;
      uVar36 = uVar22;
      if ((long)uVar19 < 1) {
LAB_0013f205:
        ppVar26 = pppVar15[uVar36] + uVar33 + uVar36 * -0x20;
      }
      else {
        if (0x20 < uVar19) {
          uVar36 = uVar33 >> 5;
          goto LAB_0013f205;
        }
        ppVar26 = ppVar8 + -1;
      }
      if (ppVar26 == ppVar12) goto LAB_0013f2cd;
      ppVar26 = ppVar10;
      if (ppVar10 == ppVar9) {
        ppVar26 = pppVar14[-1] + 0x20;
      }
      if ((long)uVar19 < 1) {
LAB_0013f259:
        pppVar32 = pppVar15 + uVar22;
        ppVar18 = *pppVar32;
        ppVar37 = ppVar18 + uVar33 + uVar22 * -0x20;
      }
      else {
        if (0x20 < uVar19) {
          uVar22 = uVar33 >> 5;
          goto LAB_0013f259;
        }
        ppVar37 = ppVar8 + -1;
        ppVar18 = ppVar20;
        pppVar32 = pppVar15;
      }
      if (ppVar37 == ppVar18) {
        ppVar37 = pppVar32[-1] + 0x20;
      }
      if (ppVar26[-1].first != ppVar37[-1].first) goto LAB_0013f2cd;
      if (ppVar8 == ppVar20) {
        ppVar20 = pppVar15[-1];
        pppVar15 = pppVar15 + -1;
        ppVar8 = ppVar20 + 0x20;
      }
      ppVar26 = ppVar10;
      if (ppVar10 == ppVar9) {
        ppVar26 = pppVar14[-1] + 0x20;
      }
      ppVar8 = ppVar8 + -1;
      ppVar37 = ppVar8;
      if (ppVar8 == ppVar20) {
        ppVar37 = pppVar15[-1] + 0x20;
      }
      puVar5[ppVar37[-1].second] = ppVar26[-1].second;
    } while( true );
  }
LAB_0013f31b:
  local_1b8 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_1b0 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar14 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_218._M_impl.super__Deque_impl_data._M_start._M_node <
      local_218._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      pppVar15 = pppVar14 + 1;
      operator_delete(pppVar14[1]);
      pppVar14 = pppVar15;
    } while (pppVar15 < local_198);
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_1b8;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_1b0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar13;
  puVar29 = (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
  if ((local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar29) {
    uVar33 = 0;
    ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
LAB_0013f38f:
    do {
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar12) {
        uVar36 = puVar29[uVar33];
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar30 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (uVar36 < ppVar30[0x1f].first) {
            (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar30[0x1f].second] = uVar33;
            operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_0013f38f;
          }
          if (uVar36 == ppVar30[0x1f].first) {
            (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar30[0x1f].second] = uVar33;
            operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
        }
        else {
          if (uVar36 < local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
            (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar33;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            goto LAB_0013f38f;
          }
          if (uVar36 == local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
            (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar33;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        }
      }
      pvVar28 = local_1c0;
      local_138.first =
           (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar33];
      local_138.second = uVar33;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,&local_138);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar33;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar33 = uVar33 + 1;
      puVar29 = (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while (uVar33 < (ulong)((long)(pvVar28->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar29 >> 3
                             ));
  }
  ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if ((_Elt_pointer)local_90 != local_188) {
    lVar35 = local_90 - (long)local_188;
    lVar34 = 0;
    do {
      if (ppVar12 == local_218._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      ppVar30 = local_118.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar34 + (long)local_188;
      uVar7 = lVar34 + (long)local_188 + local_170;
      ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      do {
        uVar33 = ppVar30->first;
        if (ppVar12 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar6 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar6[0x1f].first <= uVar33) {
            if (uVar33 == ppVar6[0x1f].first) {
              (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar6[0x1f].second] = uVar7;
              operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar6[0x1f].second] = uVar7;
          operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar12 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar10 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar12[-1].first <= uVar33) {
            if (uVar33 == ppVar12[-1].first) {
              (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar12[-1].second] = uVar7;
              ppVar12 = ppVar12 + -1;
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
            }
            break;
          }
          (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar12[-1].second] = uVar7;
          ppVar12 = ppVar12 + -1;
        }
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
      } while (ppVar12 != ppVar10);
      lVar34 = lVar34 + 1;
    } while (lVar34 != lVar35 + (ulong)(lVar35 == 0));
  }
  if (ppVar12 != local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar29 = (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar12 == ppVar10) {
        ppVar10 = pppVar13[-1];
        pppVar13 = pppVar13 + -1;
        puVar29[ppVar10[0x1f].second] = local_128;
        ppVar12 = ppVar10 + 0x20;
      }
      else {
        puVar29[ppVar12[-1].second] = local_128;
      }
      ppVar12 = ppVar12 + -1;
    } while (ppVar12 != local_218._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_1a8,&local_118);
  if (local_118.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_118.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_218);
  return;
LAB_0013f022:
  ppVar10 = ppVar9;
  if (ppVar9 == ppVar12) goto LAB_0013f033;
  goto LAB_0013eece;
LAB_0013f033:
  this = local_1a0;
  uVar36 = uVar33;
  if (ppVar9 != ppVar12) {
    ppVar8 = ppVar9;
    if (ppVar9 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar8 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_118.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + local_80) == ppVar8[-1].first)
    {
      ppVar9 = ppVar10;
      if (lVar35 != 0) {
        plVar11 = (long *)((long)&local_118.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-uVar33].first +
                          local_88);
        do {
          uVar36 = uVar33;
          if (*plVar11 != plVar11[-2]) goto LAB_0013f0b3;
          uVar33 = uVar33 + 1;
          plVar11 = plVar11 + -2;
          lVar35 = lVar35 + -1;
          uVar36 = local_98;
        } while (lVar35 != 0);
      }
      lVar35 = 0;
LAB_0013f0b3:
      ppVar10 = ppVar9;
      if (ppVar9 != ppVar12) {
        ppVar8 = ppVar9;
        if (ppVar9 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar8[-1].first !=
            local_118.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar35].first) goto LAB_0013f184;
        if (ppVar9 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
               local_170 + lVar35;
          operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar9 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar12 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar9[-1].second] = local_170 + lVar35;
          ppVar9 = ppVar9 + -1;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
        }
        goto LAB_0013f0b3;
      }
    }
  }
LAB_0013f184:
  uVar33 = uVar36 + 1;
  if (local_188 <= uVar33) goto LAB_0013f195;
  goto LAB_0013ee7d;
LAB_0013f2cd:
  if (ppVar10 == ppVar9) {
    ppVar10 = pppVar14[-1] + 0x20;
  }
  puVar29[ppVar10[-1].second] = local_128;
  if (ppVar8 == ppVar20) {
    ppVar20 = pppVar15[-1];
    pppVar15 = pppVar15 + -1;
    ppVar8 = ppVar20 + 0x20;
  }
  ppVar10 = ppVar8 + -1;
  pppVar14 = pppVar15;
  ppVar9 = ppVar20;
  this = local_1a0;
  if (ppVar10 == ppVar12) goto LAB_0013f31b;
  goto LAB_0013f1ce;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}